

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::update_target_priority(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  __node_base *p_Var4;
  string local_30;
  
  p_Var4 = &(this->peers_)._M_h._M_before_begin;
  iVar2 = this->my_priority_;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    iVar3 = *(int *)((long)&(*(_Hash_node_base **)
                              &((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)->_M_nxt
                            [9]._M_nxt + 4);
    if (iVar2 <= iVar3) {
      iVar2 = iVar3;
    }
  }
  iVar3 = 1;
  if (1 < iVar2) {
    iVar3 = iVar2;
  }
  this->target_priority_ = iVar3;
  timer_helper::reset(&this->priority_change_timer_);
  LOCK();
  (this->hb_alive_)._M_base._M_i = true;
  UNLOCK();
  (this->pre_vote_).term_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar2 = (*peVar1->_vptr_logger[7])(), 5 < iVar2)) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_30,"(update) new target priority: %d",(ulong)(uint)this->target_priority_);
    (*peVar1->_vptr_logger[8])
              (peVar1,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
               ,"update_target_priority",0xef,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void raft_server::update_target_priority() {
    // Get max priority among all peers, including myself.
    int32 max_priority = my_priority_;
    for (auto& entry: peers_) {
        peer* peer_elem = entry.second.get();
        const srv_config& s_conf = peer_elem->get_config();
        int32 cur_priority = s_conf.get_priority();
        max_priority = std::max(max_priority, cur_priority);
    }
    if (max_priority > 0) {
        target_priority_ = max_priority;
    } else {
        target_priority_ = srv_config::INIT_PRIORITY;
    }
    priority_change_timer_.reset();

    hb_alive_ = true;
    pre_vote_.reset(state_->get_term());
    p_tr("(update) new target priority: %d", target_priority_);
}